

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromExplicitFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  int *piVar1;
  size_t *psVar2;
  undefined4 *puVar3;
  LargeObjectHeader *pLVar4;
  HeapInfo *pHVar5;
  code *pcVar6;
  bool bVar7;
  LargeObjectHeader *this_00;
  FreeObject *pFVar8;
  LargeHeapBlock *this_01;
  HeapBlock *pHVar9;
  undefined6 in_register_0000000a;
  uchar attributes_00;
  FreeObject *unaff_RBX;
  FreeObject *this_02;
  long *in_FS_OFFSET;
  LargeObjectHeader *local_68;
  LargeObjectHeader *dbgHeader;
  FreeObject *local_58;
  Recycler *local_50;
  HeapBlockMap *local_48;
  uint local_3c;
  LargeHeapBucket *local_38;
  
  local_3c = (uint)CONCAT62(in_register_0000000a,attributes);
  dbgHeader = (LargeObjectHeader *)sizeCat;
  local_50 = recycler;
  local_38 = this;
  if (0x3ff < local_3c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    unaff_RBX = (FreeObject *)*in_FS_OFFSET;
    *(undefined4 *)&unaff_RBX->taggedNext = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x196,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar7) {
LAB_0024de26:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *(undefined4 *)&unaff_RBX->taggedNext = 0;
  }
  puVar3 = (undefined4 *)*in_FS_OFFSET;
  local_48 = &local_50->heapBlockMap;
  local_58 = (FreeObject *)0x0;
  this_02 = local_38->explicitFreeList;
  do {
    if (this_02 == (FreeObject *)0x0) {
      return (char *)0x0;
    }
    this_00 = LargeHeapBlock::GetHeaderFromAddress(this_02);
    if ((this_00->field_0x1a & 8) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x19e,"(header->isExplicitFreed)","header->isExplicitFreed");
      if (!bVar7) goto LAB_0024de26;
      *puVar3 = 0;
    }
    if ((this_00->objectSize + 0xff & 0xffffffffffffff00) !=
        (ulong)(local_38->super_HeapBucket).sizeCat) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x19f,
                         "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat)"
                         ,
                         "HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat"
                        );
      if (!bVar7) goto LAB_0024de26;
      *puVar3 = 0;
    }
    pLVar4 = (LargeObjectHeader *)this_00->objectSize;
    if (pLVar4 < dbgHeader) {
      pFVar8 = FreeObject::GetNext(this_02);
      local_58 = this_02;
    }
    else {
      this_00->field_0x1a = this_00->field_0x1a & 0xf7;
      pFVar8 = FreeObject::GetNext(this_02);
      if (local_58 == (FreeObject *)0x0) {
        local_38->explicitFreeList = pFVar8;
      }
      else {
        FreeObject::SetNext(local_58,pFVar8);
      }
      if (((ulong)this_02 & 0xf) == 0 && (FreeObject *)0xffff < this_02) {
        this_01 = (LargeHeapBlock *)HeapBlockMap64::GetHeapBlock(local_48,this_02);
      }
      else {
        this_01 = (LargeHeapBlock *)0x0;
      }
      if (this_01 == (LargeHeapBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0x1b3,"(heapBlockVerify != nullptr)","heapBlockVerify != nullptr");
        if (!bVar7) goto LAB_0024de26;
        *puVar3 = 0;
      }
      if ((this_01->super_HeapBlock).heapBlockType != LargeBlockType) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0x1b4,"(heapBlockVerify->IsLargeHeapBlock())",
                           "heapBlockVerify->IsLargeHeapBlock()");
        if (!bVar7) goto LAB_0024de26;
        *puVar3 = 0;
      }
      bVar7 = LargeHeapBlock::GetObjectHeader(this_01,this_02,&local_68);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0x1b7,"(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader))",
                           "largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader)");
        if (!bVar7) goto LAB_0024de26;
        *puVar3 = 0;
      }
      if (local_68 != this_00) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0x1b8,"(dbgHeader == header)","dbgHeader == header");
        if (!bVar7) goto LAB_0024de26;
        *puVar3 = 0;
      }
      this_02->taggedNext = 0;
      attributes_00 = (uchar)local_3c;
      LargeObjectHeader::SetAttributes(this_00,local_50->Cookie,attributes_00);
      unaff_RBX = this_02;
      pFVar8 = this_02;
      if ((char)attributes_00 < '\0') {
        pHVar9 = HeapBlockMap64::GetHeapBlock(local_48,this_02);
        piVar1 = (int *)((long)&pHVar9[4].address + 4);
        *piVar1 = *piVar1 + 1;
        pHVar5 = (local_38->super_HeapBucket).heapInfo;
        psVar2 = &pHVar5->liveFinalizableObjectCount;
        *psVar2 = *psVar2 + 1;
        psVar2 = &pHVar5->newFinalizableObjectCount;
        *psVar2 = *psVar2 + 1;
      }
    }
    this_02 = pFVar8;
    if (dbgHeader <= pLVar4) {
      return (char *)unaff_RBX;
    }
  } while( true );
}

Assistant:

char *
LargeHeapBucket::TryAllocFromExplicitFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    FreeObject * currFreeObject = this->explicitFreeList;
    FreeObject * prevFreeObject = nullptr;
    while (currFreeObject != nullptr)
    {
        char * memBlock = (char *)currFreeObject;
        LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(memBlock);
        Assert(header->isExplicitFreed);
        Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat);
        if (header->objectSize < sizeCat)
        {
            prevFreeObject = currFreeObject;
            currFreeObject = currFreeObject->GetNext();
            continue;
        }

        DebugOnly(header->isExplicitFreed = false);
        if (prevFreeObject)
        {
            prevFreeObject->SetNext(currFreeObject->GetNext());
        }
        else
        {
            this->explicitFreeList = currFreeObject->GetNext();
        }

#ifdef RECYCLER_MEMORY_VERIFY
        HeapBlock* heapBlockVerify = recycler->FindHeapBlock(memBlock);
        Assert(heapBlockVerify != nullptr);
        Assert(heapBlockVerify->IsLargeHeapBlock());
        LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlockVerify;
        LargeObjectHeader * dbgHeader;
        Assert(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader));
        Assert(dbgHeader == header);

        ((FreeObject *)memBlock)->DebugFillNext();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
        // TODO: large heap block doesn't separate leaf object on to different page allocator.
        // so all the memory should still be zeroed.
        memset(memBlock, 0, sizeof(FreeObject));
#endif
        header->SetAttributes(recycler->Cookie, (attributes & StoredObjectInfoBitMask));

        if ((attributes & ObjectInfoBits::FinalizeBit) != 0)
        {
            LargeHeapBlock* heapBlock = (LargeHeapBlock *)recycler->FindHeapBlock(memBlock);
            heapBlock->finalizeCount++;
#ifdef RECYCLER_FINALIZE_CHECK
            heapInfo->liveFinalizableObjectCount++;
            heapInfo->newFinalizableObjectCount++;
#endif
        }
        return memBlock;
    }

    return nullptr;
}